

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O3

void __thiscall
gog::anon_unknown_0::temporary_directory::~temporary_directory(temporary_directory *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if ((this->path).m_pathname._M_string_length != 0) {
    boost::filesystem::detail::remove_all(&this->path,(error_code *)0x0);
    if ((this->parent).m_pathname._M_string_length != 0) {
      boost::filesystem::detail::remove(&this->parent,(error_code *)0x0);
    }
  }
  pcVar1 = (this->path).m_pathname._M_dataplus._M_p;
  paVar2 = &(this->path).m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->parent).m_pathname._M_dataplus._M_p;
  paVar2 = &(this->parent).m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~temporary_directory() {
		if(!path.empty()) {
			try {
				fs::remove_all(path);
				if(!parent.empty()) {
					fs::remove(parent);
				}
			} catch(...) {
				log_error << "Could not remove temporary directory " << path << '!';
			}
		}
	}